

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O1

ion_err_t lfb_update(ion_lfb_t *bag,ion_file_offset_t offset,uint num_bytes,ion_byte_t *to_write,
                    ion_file_offset_t *next)

{
  ion_err_t iVar1;
  ion_file_offset_t in_RAX;
  ion_file_offset_t local_28;
  
  local_28 = in_RAX;
  if (next != (ion_file_offset_t *)0x0) {
    local_28 = *next;
    iVar1 = ion_fwrite_at(bag->file_handle,offset,8,(ion_byte_t *)&local_28);
    if (iVar1 != '\0') {
      return iVar1;
    }
    bag->next_empty = offset;
  }
  iVar1 = ion_fwrite_at(bag->file_handle,offset + 8,num_bytes,to_write);
  return iVar1;
}

Assistant:

ion_err_t
lfb_update(
	ion_lfb_t			*bag,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*to_write,
	ion_file_offset_t	*next
) {
	ion_err_t error;

	if (NULL != next) {
		error = lfb_update_next(bag, offset, *next);

		if (err_ok != error) {
			return error;
		}
	}

	error = ion_fwrite_at(bag->file_handle, offset + sizeof(ion_file_offset_t), num_bytes, to_write);

	return error;
}